

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

void ZydisDecodeModRM(ZydisDecodedInstruction *instruction,ZyanU8 data)

{
  ZyanU8 data_local;
  ZydisDecodedInstruction *instruction_local;
  
  if (instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0x2ad,"void ZydisDecodeModRM(ZydisDecodedInstruction *, ZyanU8)");
  }
  if ((instruction->attributes & 1) == 0) {
    if ((uint)(instruction->raw).modrm.offset == instruction->length - 1) {
      instruction->attributes = instruction->attributes | 1;
      (instruction->raw).modrm.mod = (ZyanU8)((int)(uint)data >> 6);
      (instruction->raw).modrm.reg = (byte)((int)(uint)data >> 3) & 7;
      (instruction->raw).modrm.rm = data & 7;
      return;
    }
    __assert_fail("instruction->raw.modrm.offset == instruction->length - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0x2af,"void ZydisDecodeModRM(ZydisDecodedInstruction *, ZyanU8)");
  }
  __assert_fail("!(instruction->attributes & (1ULL << 0))",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                ,0x2ae,"void ZydisDecodeModRM(ZydisDecodedInstruction *, ZyanU8)");
}

Assistant:

static void ZydisDecodeModRM(ZydisDecodedInstruction* instruction, ZyanU8 data)
{
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(!(instruction->attributes & ZYDIS_ATTRIB_HAS_MODRM));
    ZYAN_ASSERT(instruction->raw.modrm.offset == instruction->length - 1);

    instruction->attributes   |= ZYDIS_ATTRIB_HAS_MODRM;
    instruction->raw.modrm.mod = (data >> 6) & 0x03;
    instruction->raw.modrm.reg = (data >> 3) & 0x07;
    instruction->raw.modrm.rm  = (data >> 0) & 0x07;
}